

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

void __thiscall klogic::mlmvn::dump(mlmvn *this)

{
  size_t sVar1;
  const_reference this_00;
  size_type sVar2;
  ostream *poVar3;
  const_reference this_01;
  cvector *v;
  basic_ostream<char,_std::char_traits<char>_> *this_02;
  int local_24;
  int k;
  vector<klogic::mvn,_std::allocator<klogic::mvn>_> *layer_neurons;
  int layer;
  mlmvn *this_local;
  
  layer_neurons._4_4_ = 0;
  while( true ) {
    sVar1 = layers_count(this);
    if (sVar1 <= (ulong)(long)layer_neurons._4_4_) break;
    this_00 = std::
              vector<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
              ::operator[](&this->neurons,(long)layer_neurons._4_4_);
    local_24 = 0;
    while( true ) {
      sVar2 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::size(this_00);
      if (sVar2 <= (ulong)(long)local_24) break;
      poVar3 = std::operator<<((ostream *)&std::cerr,"MVN[");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_24 + 1);
      poVar3 = std::operator<<(poVar3,',');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,layer_neurons._4_4_ + 1);
      poVar3 = std::operator<<(poVar3,"]: ");
      this_01 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::operator[]
                          (this_00,(long)local_24);
      v = mvn::weights_vector(this_01);
      this_02 = operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,v);
      std::ostream::operator<<((ostream *)this_02,std::endl<char,std::char_traits<char>>);
      local_24 = local_24 + 1;
    }
    layer_neurons._4_4_ = layer_neurons._4_4_ + 1;
  }
  return;
}

Assistant:

void klogic::mlmvn::dump() const
{
    for (int layer = 0; layer < layers_count(); ++layer) {
        const vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            std::cerr << "MVN[" << (k+1) << ',' << (layer+1) << "]: " << layer_neurons[k].weights_vector() << std::endl;
        }
    }
}